

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjpeg.c
# Opt level: O1

image_u8x3_t * pjpeg_to_u8x3_baseline(pjpeg_t *pj)

{
  pjpeg_component_t *ppVar1;
  ulong uVar2;
  uint8_t uVar3;
  image_u8x3_t *piVar4;
  uint8_t uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  uint8_t uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  uint uVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  uint local_5c;
  uint local_58;
  
  if (pj->ncomponents != 3) {
    __assert_fail("pj->ncomponents == 3",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/pjpeg.c"
                  ,0x2e2,"image_u8x3_t *pjpeg_to_u8x3_baseline(pjpeg_t *)");
  }
  ppVar1 = pj->components;
  uVar7 = ppVar1->height / ppVar1[1].height;
  uVar2 = (ulong)ppVar1->width / (ulong)ppVar1[1].width;
  uVar20 = ppVar1->height / ppVar1[2].height;
  uVar18 = ppVar1->width / ppVar1[2].width;
  piVar4 = image_u8x3_create(pj->width,pj->height);
  uVar19 = (uint)uVar2;
  if (uVar19 == 1 && (uVar7 == 1 && (uVar18 == 1 && uVar20 == 1))) {
    if (pj->height != 0) {
      uVar7 = 0;
      do {
        if (pj->width != 0) {
          iVar6 = 0;
          uVar18 = 0;
          do {
            iVar13 = (uint)ppVar1->data[ppVar1->stride * uVar7 + uVar18] * 0x10000;
            iVar15 = ppVar1[2].data[ppVar1[2].stride * uVar7 + uVar18] - 0x80;
            iVar12 = iVar15 * 0x166e9 + iVar13 >> 0x10;
            if (0xfe < iVar12) {
              iVar12 = 0xff;
            }
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            iVar17 = ppVar1[1].data[ppVar1[1].stride * uVar7 + uVar18] - 0x80;
            piVar4->buf[(int)(piVar4->stride * uVar7 + iVar6)] = (uint8_t)iVar12;
            iVar12 = iVar15 * -0xb6d2 + iVar17 * -0x581a + iVar13 >> 0x10;
            if (0xfe < iVar12) {
              iVar12 = 0xff;
            }
            if (iVar12 < 1) {
              iVar12 = 0;
            }
            piVar4->buf[(long)(int)(piVar4->stride * uVar7 + iVar6) + 1] = (uint8_t)iVar12;
            iVar13 = iVar17 * 0x1c5a2 + iVar13 >> 0x10;
            if (0xfe < iVar13) {
              iVar13 = 0xff;
            }
            if (iVar13 < 1) {
              iVar13 = 0;
            }
            piVar4->buf[(long)(int)(piVar4->stride * uVar7 + iVar6) + 2] = (uint8_t)iVar13;
            uVar18 = uVar18 + 1;
            iVar6 = iVar6 + 3;
          } while (uVar18 < pj->width);
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < pj->height);
    }
  }
  else if (uVar19 == uVar18 && uVar7 == uVar20) {
    if (uVar7 <= pj->height) {
      local_5c = 0;
      do {
        if (uVar19 <= pj->width) {
          local_58 = 0;
          do {
            if (0 < (int)uVar7) {
              iVar12 = ppVar1[1].data[ppVar1[1].stride * local_5c + local_58] - 0x80;
              iVar13 = ppVar1[2].data[ppVar1[2].stride * local_5c + local_58] - 0x80;
              iVar6 = 0;
              do {
                if (0 < (int)uVar19) {
                  iVar17 = iVar6 + local_5c * uVar7;
                  iVar15 = 0;
                  do {
                    iVar11 = iVar15 + local_58 * uVar19;
                    iVar8 = (uint)ppVar1->data[ppVar1->stride * iVar17 + iVar11] * 0x10000;
                    iVar10 = iVar8 + iVar13 * 0x166e9 >> 0x10;
                    if (0xfe < iVar10) {
                      iVar10 = 0xff;
                    }
                    if (iVar10 < 1) {
                      iVar10 = 0;
                    }
                    iVar11 = iVar11 * 3;
                    piVar4->buf[piVar4->stride * iVar17 + iVar11] = (uint8_t)iVar10;
                    iVar10 = iVar13 * -0xb6d2 + iVar12 * -0x581a + iVar8 >> 0x10;
                    if (0xfe < iVar10) {
                      iVar10 = 0xff;
                    }
                    if (iVar10 < 1) {
                      iVar10 = 0;
                    }
                    piVar4->buf[(long)(piVar4->stride * iVar17 + iVar11) + 1] = (uint8_t)iVar10;
                    iVar8 = iVar8 + iVar12 * 0x1c5a2 >> 0x10;
                    if (0xfe < iVar8) {
                      iVar8 = 0xff;
                    }
                    if (iVar8 < 1) {
                      iVar8 = 0;
                    }
                    piVar4->buf[(long)(piVar4->stride * iVar17 + iVar11) + 2] = (uint8_t)iVar8;
                    iVar15 = iVar15 + 1;
                  } while (iVar15 < (int)uVar19);
                }
                iVar6 = iVar6 + 1;
              } while (iVar6 < (int)uVar7);
            }
            local_58 = local_58 + 1;
          } while (local_58 < (uint)(pj->width / uVar2));
        }
        local_5c = local_5c + 1;
      } while (local_5c < pj->height / uVar7);
    }
  }
  else if (pj->height != 0) {
    uVar9 = 0;
    do {
      if (pj->width != 0) {
        iVar6 = 0;
        uVar14 = 0;
        do {
          dVar21 = (double)ppVar1->data[ppVar1->stride * uVar9 + uVar14];
          dVar22 = (double)(int)(ppVar1[2].data
                                 [(int)uVar14 / (int)uVar18 +
                                  ppVar1[2].stride * ((int)uVar9 / (int)uVar20)] - 0x80);
          dVar23 = dVar22 * 1.402 + dVar21;
          if (0.0 <= dVar23) {
            uVar3 = 0xff;
            if (dVar23 <= 255.0) {
              uVar3 = (uint8_t)(int)dVar23;
            }
          }
          else {
            uVar3 = '\0';
          }
          dVar23 = (double)(int)(ppVar1[1].data
                                 [(int)uVar14 / (int)uVar19 +
                                  ppVar1[1].stride * ((int)uVar9 / (int)uVar7)] - 0x80);
          dVar22 = dVar22 * -0.71414 + dVar23 * -0.34414 + dVar21;
          if (0.0 <= dVar22) {
            uVar5 = 0xff;
            if (dVar22 <= 255.0) {
              uVar5 = (uint8_t)(int)dVar22;
            }
          }
          else {
            uVar5 = '\0';
          }
          dVar21 = dVar23 * 1.772 + dVar21;
          if (0.0 <= dVar21) {
            uVar16 = 0xff;
            if (dVar21 <= 255.0) {
              uVar16 = (uint8_t)(int)dVar21;
            }
          }
          else {
            uVar16 = '\0';
          }
          piVar4->buf[(int)(piVar4->stride * uVar9 + iVar6)] = uVar3;
          piVar4->buf[(long)(int)(piVar4->stride * uVar9 + iVar6) + 1] = uVar5;
          piVar4->buf[(long)(int)(piVar4->stride * uVar9 + iVar6) + 2] = uVar16;
          uVar14 = uVar14 + 1;
          iVar6 = iVar6 + 3;
        } while (uVar14 < pj->width);
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < pj->height);
  }
  return piVar4;
}

Assistant:

image_u8x3_t *pjpeg_to_u8x3_baseline(pjpeg_t *pj)
{
    assert(pj->ncomponents == 3);

    pjpeg_component_t *Y = &pj->components[0];
    pjpeg_component_t *Cb = &pj->components[1];
    pjpeg_component_t *Cr = &pj->components[2];

    int Cb_factor_y = Y->height / Cb->height;
    int Cb_factor_x = Y->width / Cb->width;

    int Cr_factor_y = Y->height / Cr->height;
    int Cr_factor_x = Y->width / Cr->width;

    image_u8x3_t *im = image_u8x3_create(pj->width, pj->height);

    if (Cr_factor_y == 1 && Cr_factor_x == 1 && Cb_factor_y == 1 && Cb_factor_x == 1) {

        for (int y = 0; y < pj->height; y++) {
            for (int x = 0; x < pj->width; x++) {
                int32_t y_val  = Y->data[y*Y->stride + x] * 65536;
                int32_t cb_val = Cb->data[y*Cb->stride + x] - 128;
                int32_t cr_val = Cr->data[y*Cr->stride + x] - 128;

                int32_t r_val = y_val +  91881 * cr_val;
                int32_t g_val = y_val + -22554 * cb_val - 46802 * cr_val;
                int32_t b_val = y_val + 116130 * cb_val;

                im->buf[y*im->stride + 3*x + 0 ] = clamp_u8(r_val >> 16);
                im->buf[y*im->stride + 3*x + 1 ] = clamp_u8(g_val >> 16);
                im->buf[y*im->stride + 3*x + 2 ] = clamp_u8(b_val >> 16);
            }
        }
    } else if (Cb_factor_y == Cr_factor_y && Cb_factor_x == Cr_factor_x) {
        for (int by = 0; by < pj->height / Cb_factor_y; by++) {
            for (int bx = 0; bx < pj->width / Cb_factor_x; bx++) {

                int32_t cb_val = Cb->data[by*Cb->stride + bx] - 128;
                int32_t cr_val = Cr->data[by*Cr->stride + bx] - 128;

                int32_t r0 =  91881 * cr_val;
                int32_t g0 = -22554 * cb_val - 46802 * cr_val;
                int32_t b0 = 116130 * cb_val;

                for (int dy = 0; dy < Cb_factor_y; dy++) {
                    int y = by*Cb_factor_y + dy;

                    for (int dx = 0; dx < Cb_factor_x; dx++) {
                        int x = bx*Cb_factor_x + dx;

                        int32_t y_val = Y->data[y*Y->stride + x] * 65536;

                        int32_t r_val = r0 + y_val;
                        int32_t g_val = g0 + y_val;
                        int32_t b_val = b0 + y_val;

                        im->buf[y*im->stride + 3*x + 0 ] = clamp_u8(r_val >> 16);
                        im->buf[y*im->stride + 3*x + 1 ] = clamp_u8(g_val >> 16);
                        im->buf[y*im->stride + 3*x + 2 ] = clamp_u8(b_val >> 16);
                    }
                }
            }
        }
    } else {

        for (int y = 0; y < pj->height; y++) {
            for (int x = 0; x < pj->width; x++) {
                int32_t y_val  = Y->data[y*Y->stride + x];
                int32_t cb_val = Cb->data[(y / Cb_factor_y)*Cb->stride + (x / Cb_factor_x)] - 128;
                int32_t cr_val = Cr->data[(y / Cr_factor_y)*Cr->stride + (x / Cr_factor_x)] - 128;

                uint8_t r_val = clampd(y_val + 1.402 * cr_val);
                uint8_t g_val = clampd(y_val - 0.34414 * cb_val - 0.71414 * cr_val);
                uint8_t b_val = clampd(y_val + 1.772 * cb_val);

                im->buf[y*im->stride + 3*x + 0 ] = r_val;
                im->buf[y*im->stride + 3*x + 1 ] = g_val;
                im->buf[y*im->stride + 3*x + 2 ] = b_val;
            }
        }
    }

    return im;
}